

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

void mod2sparse_add(mod2sparse *m1,mod2sparse *m2,mod2sparse *r)

{
  int col;
  int iVar1;
  mod2entry *pmVar2;
  char *__ptr;
  int row;
  long lVar3;
  mod2entry *pmVar4;
  size_t sStack_40;
  
  if ((((m1->n_rows == r->n_rows) && (m1->n_cols == r->n_cols)) && (m2->n_rows == m1->n_rows)) &&
     (m2->n_cols == m1->n_cols)) {
    if ((r != m1) && (r != m2)) {
      mod2sparse_clear(r);
      lVar3 = 0;
LAB_001267b0:
      if (r->n_rows <= lVar3) {
        return;
      }
      pmVar2 = m1->rows + lVar3;
      pmVar4 = m2->rows[lVar3].right;
LAB_001267d5:
      do {
        pmVar2 = pmVar2->right;
        while( true ) {
          iVar1 = pmVar2->row;
          row = (int)lVar3;
          if ((iVar1 < 0) || (pmVar4->row < 0)) goto LAB_0012682d;
          iVar1 = pmVar2->col;
          col = pmVar4->col;
          if (iVar1 == col) {
            pmVar4 = pmVar4->right;
            goto LAB_001267d5;
          }
          if (iVar1 < col) break;
          mod2sparse_insert(r,row,col);
          pmVar4 = pmVar4->right;
        }
        mod2sparse_insert(r,row,iVar1);
      } while( true );
    }
    __ptr = "mod2sparse_add: Result matrix is the same as one of the operands\n";
    sStack_40 = 0x41;
  }
  else {
    __ptr = "mod2sparse_add: Matrices have different dimensions\n";
    sStack_40 = 0x33;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
  exit(1);
LAB_0012682d:
  while (-1 < iVar1) {
    mod2sparse_insert(r,row,pmVar2->col);
    pmVar2 = pmVar2->right;
    iVar1 = pmVar2->row;
  }
  for (; -1 < pmVar4->row; pmVar4 = pmVar4->right) {
    mod2sparse_insert(r,row,pmVar4->col);
  }
  lVar3 = lVar3 + 1;
  goto LAB_001267b0;
}

Assistant:

void mod2sparse_add
( mod2sparse *m1,	/* Left operand of add */
  mod2sparse *m2,	/* Right operand of add */
  mod2sparse *r		/* Place to store result of add */
)
{
  mod2entry *e1, *e2;
  int i;

  if (mod2sparse_rows(m1)!=mod2sparse_rows(r) 
   || mod2sparse_cols(m1)!=mod2sparse_cols(r) 
   || mod2sparse_rows(m2)!=mod2sparse_rows(r)
   || mod2sparse_cols(m2)!=mod2sparse_cols(r)) 
  { fprintf(stderr,"mod2sparse_add: Matrices have different dimensions\n");
    exit(1);
  }

  if (r==m1 || r==m2)
  { fprintf(stderr,
     "mod2sparse_add: Result matrix is the same as one of the operands\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(r); i++)
  { 
    e1 = mod2sparse_first_in_row(m1,i);
    e2 = mod2sparse_first_in_row(m2,i);

    while (!mod2sparse_at_end(e1) && !mod2sparse_at_end(e2))
    { 
      if (mod2sparse_col(e1)==mod2sparse_col(e2))
      { e1 = mod2sparse_next_in_row(e1);
        e2 = mod2sparse_next_in_row(e2); 
      }

      else if (mod2sparse_col(e1)<mod2sparse_col(e2))
      { mod2sparse_insert(r,i,mod2sparse_col(e1));
        e1 = mod2sparse_next_in_row(e1);
      }

      else
      { mod2sparse_insert(r,i,mod2sparse_col(e2));
        e2 = mod2sparse_next_in_row(e2);       
      }
    }

    while (!mod2sparse_at_end(e1))
    { mod2sparse_insert(r,i,mod2sparse_col(e1));
      e1 = mod2sparse_next_in_row(e1);
    }

    while (!mod2sparse_at_end(e2))
    { mod2sparse_insert(r,i,mod2sparse_col(e2));
      e2 = mod2sparse_next_in_row(e2);
    }
  }
}